

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O0

void mk_rconf_free(mk_rconf *conf)

{
  mk_list **section_00;
  mk_list *__mptr_2;
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_rconf_file *file;
  mk_rconf_entry *entry;
  mk_rconf_section *section;
  mk_list *tmp;
  mk_list *head;
  mk_rconf *conf_local;
  
  tmp = (conf->includes).next;
  section = (mk_rconf_section *)tmp->next;
  while (tmp != &conf->includes) {
    mk_list_del(tmp);
    mk_mem_free(tmp[-1].next);
    mk_mem_free(&tmp[-1].next);
    tmp = (mk_list *)section;
    section = (mk_rconf_section *)(section->entries).prev;
  }
  tmp = (conf->metas).next;
  section = (mk_rconf_section *)tmp->next;
  while (tmp != &conf->metas) {
    mk_list_del(tmp);
    mk_mem_free(tmp[-1].prev);
    mk_mem_free(tmp[-1].next);
    mk_mem_free(tmp + -1);
    tmp = (mk_list *)section;
    section = (mk_rconf_section *)(section->entries).prev;
  }
  tmp = (conf->sections).next;
  section = (mk_rconf_section *)tmp->next;
  while (tmp != &conf->sections) {
    section_00 = &tmp[-2].next;
    mk_list_del(tmp);
    mk_rconf_free_entries((mk_rconf_section *)section_00);
    mk_mem_free(*section_00);
    mk_mem_free(section_00);
    tmp = (mk_list *)section;
    section = (mk_rconf_section *)(section->entries).prev;
  }
  if (conf->file != (char *)0x0) {
    mk_mem_free(conf->file);
  }
  mk_mem_free(conf->root_path);
  mk_mem_free(conf);
  return;
}

Assistant:

void mk_rconf_free(struct mk_rconf *conf)
{
    struct mk_list *head, *tmp;
    struct mk_rconf_section *section;
    struct mk_rconf_entry *entry;
    struct mk_rconf_file *file;

    /* Remove included files */
    mk_list_foreach_safe(head, tmp, &conf->includes) {
        file = mk_list_entry(head, struct mk_rconf_file, _head);
        mk_list_del(&file->_head);
        mk_mem_free(file->path);
        mk_mem_free(file);
    }

    /* Remove metas */
    mk_list_foreach_safe(head, tmp, &conf->metas) {
        entry = mk_list_entry(head, struct mk_rconf_entry, _head);
        mk_list_del(&entry->_head);
        mk_mem_free(entry->key);
        mk_mem_free(entry->val);
        mk_mem_free(entry);
    }

    /* Free sections */
    mk_list_foreach_safe(head, tmp, &conf->sections) {
        section = mk_list_entry(head, struct mk_rconf_section, _head);
        mk_list_del(&section->_head);

        /* Free section entries */
        mk_rconf_free_entries(section);

        /* Free section node */
        mk_mem_free(section->name);
        mk_mem_free(section);
    }
    if (conf->file) {
        mk_mem_free(conf->file);
    }

    mk_mem_free(conf->root_path);
    mk_mem_free(conf);
}